

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall
QuantizeData::threshold_distribution
          (QuantizeData *this,vector<float,_std::allocator<float>_> *distribution,int target_bin)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first_00;
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  QuantizeData *this_00;
  int in_EDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  float fVar5;
  float fVar6;
  double dVar7;
  float kl_divergence;
  int j_2;
  float expand_value;
  int j_1;
  float right_scale_1;
  int right_lower_1;
  float left_scale_1;
  int left_upper_1;
  float count;
  float end_1;
  float start_1;
  int i_1;
  vector<float,_std::allocator<float>_> expand_distribution;
  int j;
  float right_scale;
  int right_lower;
  float left_scale;
  int left_upper;
  float end;
  float start;
  int i;
  float num_per_bin;
  vector<float,_std::allocator<float>_> t_distribution;
  int threshold_1;
  int threshold;
  float threshold_sum;
  vector<float,_std::allocator<float>_> quantize_distribution;
  int length;
  float min_kl_divergence;
  int target_threshold;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe90;
  allocator_type *in_stack_fffffffffffffe98;
  value_type in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  value_type in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  float in_stack_fffffffffffffeb0;
  value_type in_stack_fffffffffffffeb4;
  int local_114;
  int local_10c;
  float local_108;
  float local_100;
  float local_f8;
  int local_ec;
  allocator_type local_e5;
  undefined4 local_e4;
  vector<float,_std::allocator<float>_> local_e0;
  int local_c8;
  float local_c4;
  int local_c0;
  float local_bc;
  int local_b8;
  float local_b4;
  float local_b0;
  int local_ac;
  float local_a8;
  undefined4 local_a4;
  float *local_a0;
  float *local_98;
  float *local_88;
  float *local_80;
  float *local_78;
  vector<float,_std::allocator<float>_> local_70;
  int local_58;
  int local_54;
  float local_50;
  vector<float,_std::allocator<float>_> local_38;
  int local_20;
  float local_1c;
  int local_18;
  int local_14;
  vector<float,_std::allocator<float>_> *local_10;
  
  local_1c = 1000.0;
  local_18 = in_EDX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  local_20 = (int)sVar2;
  std::allocator<float>::allocator((allocator<float> *)0x114e77);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe90,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::allocator<float>::~allocator((allocator<float> *)0x114e9d);
  local_50 = 0.0;
  for (local_54 = local_14; local_54 < local_20; local_54 = local_54 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)local_54);
    local_50 = *pvVar3 + local_50;
  }
  for (local_58 = local_14; local_58 < local_20; local_58 = local_58 + 1) {
    local_78 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_88 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_80 = (float *)__gnu_cxx::
                        __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        ::operator+((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                                    ,CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::allocator<float>::allocator((allocator<float> *)0x114fa6);
    __first_00._M_current._4_4_ = in_stack_fffffffffffffeb4;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffeb0;
    __last_00._M_current._4_4_ = in_stack_fffffffffffffeac;
    __last_00._M_current._0_4_ = in_stack_fffffffffffffea8;
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),__first_00,__last_00,
               in_stack_fffffffffffffe98);
    std::allocator<float>::~allocator((allocator<float> *)0x114fd7);
    fVar5 = local_50;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_70,(long)(local_58 + -1))
    ;
    *pvVar4 = *pvVar4 + fVar5;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)local_58);
    local_50 = local_50 - *pvVar3;
    local_98 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_a0 = (float *)std::vector<float,_std::allocator<float>_>::end
                                  ((vector<float,_std::allocator<float>_> *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_a4 = 0;
    __first._M_current._4_4_ = in_stack_fffffffffffffe84;
    __first._M_current._0_4_ = in_stack_fffffffffffffe80;
    __last._M_current._4_4_ = in_stack_fffffffffffffe7c;
    __last._M_current._0_4_ = in_stack_fffffffffffffe78;
    std::fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,int>
              (__first,__last,(int *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_a8 = (float)local_58 / (float)local_14;
    for (local_ac = 0; local_ac < local_14; local_ac = local_ac + 1) {
      local_b0 = (float)local_ac * local_a8;
      local_b4 = local_b0 + local_a8;
      dVar7 = std::ceil((double)(ulong)(uint)local_b0);
      local_b8 = (int)SUB84(dVar7,0);
      if (local_b0 < (float)local_b8) {
        in_stack_fffffffffffffeb0 = (float)local_b8 - local_b0;
        local_bc = in_stack_fffffffffffffeb0;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (local_10,(long)(local_b8 + -1));
        in_stack_fffffffffffffeb4 = *pvVar3;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_ac);
        *pvVar4 = in_stack_fffffffffffffeb0 * in_stack_fffffffffffffeb4 + *pvVar4;
      }
      dVar7 = std::floor((double)(ulong)(uint)local_b4);
      in_stack_fffffffffffffeac = SUB84(dVar7,0);
      local_c0 = (int)in_stack_fffffffffffffeac;
      if ((float)local_c0 < local_b4) {
        in_stack_fffffffffffffea4 = local_b4 - (float)local_c0;
        local_c4 = in_stack_fffffffffffffea4;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)local_c0);
        in_stack_fffffffffffffea8 = *pvVar3;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_ac);
        *pvVar4 = in_stack_fffffffffffffea4 * in_stack_fffffffffffffea8 + *pvVar4;
      }
      for (local_c8 = local_b8; local_c8 < local_c0; local_c8 = local_c8 + 1) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)local_c8);
        in_stack_fffffffffffffea0 = *pvVar3;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_ac);
        *pvVar4 = in_stack_fffffffffffffea0 + *pvVar4;
      }
    }
    this_00 = (QuantizeData *)(long)local_58;
    local_e4 = 0;
    in_stack_fffffffffffffe98 = &local_e5;
    std::allocator<float>::allocator((allocator<float> *)0x115381);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this_00,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::allocator<float>::~allocator((allocator<float> *)0x1153af);
    for (local_ec = 0; local_ec < local_14; local_ec = local_ec + 1) {
      fVar5 = (float)local_ec * local_a8;
      fVar6 = fVar5 + local_a8;
      local_f8 = 0.0;
      dVar7 = std::ceil((double)(ulong)(uint)fVar5);
      in_stack_fffffffffffffe8c = SUB84(dVar7,0);
      local_114 = (int)in_stack_fffffffffffffe8c;
      local_100 = 0.0;
      if (fVar5 < (float)local_114) {
        local_100 = (float)local_114 - fVar5;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (local_10,(long)(local_114 + -1));
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          local_f8 = local_100 + 0.0;
        }
      }
      dVar7 = std::floor((double)(ulong)(uint)fVar6);
      in_stack_fffffffffffffe88 = SUB84(dVar7,0);
      iVar1 = (int)in_stack_fffffffffffffe88;
      local_108 = 0.0;
      local_10c = local_114;
      if ((float)iVar1 < fVar6) {
        local_108 = fVar6 - (float)iVar1;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)iVar1);
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          local_f8 = local_108 + local_f8;
        }
      }
      for (; local_10c < iVar1; local_10c = local_10c + 1) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)local_10c);
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          local_f8 = local_f8 + 1.0;
        }
      }
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_ec);
      local_f8 = *pvVar4 / local_f8;
      if (fVar5 < (float)local_114) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (local_10,(long)(local_114 + -1));
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          in_stack_fffffffffffffe80 = local_f8;
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_e0,(long)(local_114 + -1));
          *pvVar4 = in_stack_fffffffffffffe80 * local_100 + *pvVar4;
          in_stack_fffffffffffffe84 = local_100;
        }
      }
      if ((float)iVar1 < fVar6) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)iVar1);
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          in_stack_fffffffffffffe78 = local_f8;
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_e0,(long)iVar1);
          *pvVar4 = in_stack_fffffffffffffe78 * local_108 + *pvVar4;
          in_stack_fffffffffffffe7c = local_108;
        }
      }
      for (; local_114 < iVar1; local_114 = local_114 + 1) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,(long)local_114);
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          in_stack_fffffffffffffe74 = local_f8;
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_e0,(long)local_114)
          ;
          *pvVar4 = in_stack_fffffffffffffe74 + *pvVar4;
        }
      }
    }
    in_stack_fffffffffffffe70 =
         compute_kl_divergence
                   (this_00,(vector<float,_std::allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                    (vector<float,_std::allocator<float>_> *)
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if (in_stack_fffffffffffffe70 < local_1c) {
      local_18 = local_58;
      local_1c = in_stack_fffffffffffffe70;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  return local_18;
}

Assistant:

int QuantizeData::threshold_distribution(const std::vector<float> &distribution, const int target_bin) 
{
    int target_threshold = target_bin;
    float min_kl_divergence = 1000;
    const int length = distribution.size();

    std::vector<float> quantize_distribution(target_bin);

    float threshold_sum = 0;
    for (int threshold=target_bin; threshold<length; threshold++) 
    {
        threshold_sum += distribution[threshold];
    }

    for (int threshold=target_bin; threshold<length; threshold++) 
    {

        std::vector<float> t_distribution(distribution.begin(), distribution.begin()+threshold);
        
        t_distribution[threshold-1] += threshold_sum; 
        threshold_sum -= distribution[threshold];

        // get P
        fill(quantize_distribution.begin(), quantize_distribution.end(), 0);
        
        const float num_per_bin = static_cast<float>(threshold) / target_bin;

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            const int left_upper = ceil(start);
            if (left_upper > start) 
            {
                const float left_scale = left_upper - start;
                quantize_distribution[i] += left_scale * distribution[left_upper - 1];
            }

            const int right_lower = floor(end);

            if (right_lower < end) 
            {

                const float right_scale = end - right_lower;
                quantize_distribution[i] += right_scale * distribution[right_lower];
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                quantize_distribution[i] += distribution[j];
            }
        }

        // get Q
        std::vector<float> expand_distribution(threshold, 0);

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            float count = 0;

            const int left_upper = ceil(start);
            float left_scale = 0;
            if (left_upper > start) 
            {
                left_scale = left_upper - start;
                if (distribution[left_upper - 1] != 0) 
                {
                    count += left_scale;
                }
            }

            const int right_lower = floor(end);
            float right_scale = 0;
            if (right_lower < end) 
            {
                right_scale = end - right_lower;
                if (distribution[right_lower] != 0) 
                {
                    count += right_scale;
                }
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    count++;
                }
            }

            const float expand_value = quantize_distribution[i] / count;

            if (left_upper > start) 
            {
                if (distribution[left_upper - 1] != 0) 
                {
                    expand_distribution[left_upper - 1] += expand_value * left_scale;
                }
            }
            if (right_lower < end) 
            {
                if (distribution[right_lower] != 0) 
                {
                    expand_distribution[right_lower] += expand_value * right_scale;
                }
            }
            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    expand_distribution[j] += expand_value;
                }
            }
        }

        // kl
        float kl_divergence = compute_kl_divergence(t_distribution, expand_distribution);

        // the best num of bin
        if (kl_divergence < min_kl_divergence) 
        {
            min_kl_divergence = kl_divergence;
            target_threshold = threshold;
        }
    }

    return target_threshold;
}